

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

int __thiscall Fl_Text_Display::xy_to_position(Fl_Text_Display *this,int X,int Y,int posType)

{
  int iVar1;
  int iVar2;
  int in_R8D;
  int in_R9D;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  
  iVar1 = (Y - (this->text_area).y) / this->mMaxsize;
  if (iVar1 < 0) {
    iVar1 = this->mFirstChar;
  }
  else {
    iVar2 = this->mNVisibleLines + -1;
    if (iVar1 < this->mNVisibleLines) {
      iVar2 = iVar1;
    }
    iVar1 = this->mLineStarts[iVar2];
    if (iVar1 == -1) {
      iVar1 = this->mBuffer->mLength;
    }
    else {
      iVar2 = vline_length(this,iVar2);
      iVar1 = handle_vline(this,1,iVar1,iVar2,in_R8D,in_R9D,0,in_stack_ffffffffffffffd0,
                           in_stack_ffffffffffffffd8,X);
    }
  }
  return iVar1;
}

Assistant:

int Fl_Text_Display::xy_to_position( int X, int Y, int posType ) const {
  int lineStart, lineLen, fontHeight;
  int visLineNum;

  /* Find the visible line number corresponding to the Y coordinate */
  fontHeight = mMaxsize;
  visLineNum = ( Y - text_area.y ) / fontHeight;
  if ( visLineNum < 0 )
    return mFirstChar;
  if ( visLineNum >= mNVisibleLines )
    visLineNum = mNVisibleLines - 1;

  /* Find the position at the start of the line */
  lineStart = mLineStarts[ visLineNum ];

  /* If the line start was empty, return the last position in the buffer */
  if ( lineStart == -1 )
    return mBuffer->length();

  /* Get the line text and its length */
  lineLen = vline_length( visLineNum );

  return handle_vline(FIND_INDEX,
                      lineStart, lineLen, 0, 0,
                      0, 0,
                      text_area.x, X);
}